

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_handler.c
# Opt level: O2

symtype lh_load_sym(soHandle_t h,char *symName)

{
  char cVar1;
  __int32_t **pp_Var2;
  symtype pvVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char ucbuf [257];
  char lcbuf [257];
  char ocbuf [257];
  
  iVar6 = 1;
  lVar5 = 0;
  do {
    pcVar8 = symName;
    switch(iVar6) {
    case 2:
      lVar5 = 0;
      pcVar7 = lcbuf;
      while( true ) {
        pcVar7 = pcVar7 + 1;
        cVar1 = symName[lVar5];
        if ((long)cVar1 == 0) break;
        pp_Var2 = __ctype_tolower_loc();
        pcVar7[-1] = (char)(*pp_Var2)[cVar1];
        lVar5 = lVar5 + 1;
      }
      pcVar7[-1] = '_';
      goto LAB_0010b3bb;
    case 3:
      pcVar7 = ucbuf;
      while( true ) {
        pcVar7 = pcVar7 + 1;
        cVar1 = *pcVar8;
        if ((long)cVar1 == 0) break;
        pp_Var2 = __ctype_toupper_loc();
        pcVar7[-1] = (char)(*pp_Var2)[cVar1];
        pcVar8 = pcVar8 + 1;
      }
      pcVar7[-1] = '_';
      pcVar8 = ucbuf;
      break;
    case 4:
      pcVar8 = ocbuf;
      c_strcpy(pcVar8,symName);
      pcVar7 = ocbuf + lVar5 + 1;
      ocbuf[lVar5] = '_';
      break;
    case 5:
      pcVar7 = lcbuf + lVar5;
LAB_0010b3bb:
      pcVar8 = lcbuf;
      break;
    case 6:
      pcVar7 = ucbuf + lVar5;
      pcVar8 = ucbuf;
      break;
    case 7:
      return (symtype)0x0;
    default:
      goto switchD_0010b30a_default;
    }
    *pcVar7 = '\0';
switchD_0010b30a_default:
    pvVar3 = (symtype)dlsym(h,pcVar8);
    lVar4 = dlerror();
    if (lVar4 == 0) {
      return pvVar3;
    }
    printf("ERROR in %s: ","lh_load_sym");
    printf("Cannot find symbol %s in dynamic library, error = %s",symName,lVar4);
    putchar(10);
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

symtype lh_load_sym (soHandle_t h, const char *symName) {
    symtype s;
    const char *from;
    char *to;
    const char *tripSym;
    char* err;
    char lcbuf[257];
    char ucbuf[257];
    char ocbuf[257];
    size_t symLen;
    int trip;

    s = OSQP_NULL;
    err = OSQP_NULL;

    /* search in this order:
     *  1. original
     *  2. lower_
     *  3. upper_
     *  4. original_
     *  5. lower
     *  6. upper
     */

    symLen = 0;
    for (trip = 1;  trip <= 6;  trip++) {
        switch (trip) {
        case 1:                             /* original */
            tripSym = symName;
            break;
        case 2:                             /* lower_ */
            for (from = symName, to = lcbuf;  *from;  from++, to++) {
                *to = tolower(*from);
            }
            symLen = from - symName;
            *to++ = '_';
            *to = '\0';
            tripSym = lcbuf;
            break;
        case 3:                             /* upper_ */
            for (from = symName, to = ucbuf;  *from;  from++, to++) {
                *to = toupper(*from);
            }
            *to++ = '_';
            *to = '\0';
            tripSym = ucbuf;
            break;
        case 4:                             /* original_ */
            c_strcpy(ocbuf, symName);
            ocbuf[symLen] = '_';
            ocbuf[symLen+1] = '\0';
            tripSym = ocbuf;
            break;
        case 5:                             /* lower */
            lcbuf[symLen] = '\0';
            tripSym = lcbuf;
            break;
        case 6:                             /* upper */
            ucbuf[symLen] = '\0';
            tripSym = ucbuf;
            break;
        default:
            tripSym = symName;
        } /* end switch */
#ifdef IS_WINDOWS
        s = GetProcAddress (h, tripSym);
        if (s) {
            return s;
        } else {
            #ifdef PRINTING
            c_eprint("Cannot find symbol %s in dynamic library, error = %d",
                    symName, (int)GetLastError());
            #endif
        }
#else
        s = dlsym (h, tripSym);
        err = dlerror();  /* we have only one chance; a successive call to dlerror() returns OSQP_NULL */
        if (err) {
            #ifdef PRINTING
            c_eprint("Cannot find symbol %s in dynamic library, error = %s",
                    symName, err);
            #endif
        } else {
            return s;
        }
#endif
    } /* end loop over symbol name variations */

    return OSQP_NULL;
}